

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedefNameTypeResolver.cpp
# Opt level: O2

Action __thiscall
psy::C::TypedefNameTypeResolver::visitIdentifierDeclarator
          (TypedefNameTypeResolver *this,IdentifierDeclaratorSyntax *node)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *this_00;
  undefined4 extraout_var;
  Type *pTVar3;
  TypedefNameType *this_01;
  ostream *poVar4;
  ostream *this_02;
  Action AVar5;
  
  AVar5 = Skip;
  if (this->inTydefDecltor_ == true) {
    this_00 = &SemanticModel::declarationBy(this->semaModel_,&node->super_DeclaratorSyntax)->
               super_Symbol;
    if (this_00 == (Symbol *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypedefNameTypeResolver.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar2 = 0x40;
    }
    else {
      SVar1 = Symbol::kind(this_00);
      if (SVar1 == TypedefDeclaration) {
        iVar2 = (*this_00->_vptr_Symbol[0x22])(this_00);
        pTVar3 = TypedefDeclarationSymbol::synonymizedType
                           ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
        pTVar3 = resolve(this,pTVar3);
        this_01 = TypedefDeclarationSymbol::introducedSynonymType
                            ((TypedefDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
        TypedefNameType::setResolvedSynonymizedType(this_01,pTVar3);
        return Skip;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypedefNameTypeResolver.cpp"
                              );
      this_02 = (ostream *)std::operator<<(poVar4,":");
      iVar2 = 0x41;
    }
    poVar4 = (ostream *)std::ostream::operator<<(this_02,iVar2);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"<empty message>");
    std::endl<char,std::char_traits<char>>(poVar4);
    AVar5 = Quit;
  }
  return AVar5;
}

Assistant:

SyntaxVisitor::Action TypedefNameTypeResolver::visitIdentifierDeclarator(
        const IdentifierDeclaratorSyntax* node)
{
    if (!inTydefDecltor_)
        return Action::Skip;

    auto decl = semaModel_->declarationBy(node);
    PSY_ASSERT_2(decl, return Action::Quit);
    PSY_ASSERT_2(decl->kind() == SymbolKind::TypedefDeclaration, return Action::Quit);
    auto tydefDecl = decl->asTypedefDeclaration();
    auto resolvedTy = resolve(tydefDecl->synonymizedType());
    auto tydefNameTy = tydefDecl->introducedSynonymType();
    const_cast<TypedefNameType*>(tydefNameTy)->setResolvedSynonymizedType(resolvedTy);

    return Action::Skip;
}